

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check.h
# Opt level: O2

void __thiscall
mp::
SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::CheckObjs(SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
            *this,SolCheck *chk)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *x;
  VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *extraout_RDX;
  bool bVar4;
  double dVar5;
  Violation viol;
  
  lVar2 = (long)this[-7].recomp_fn._M_invoker -
          (long)this[-7].recomp_fn.super__Function_base._M_manager;
  uVar3 = lVar2 / 0x1e8;
  x = (VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *)(lVar2 % 0x1e8);
  uVar1 = (chk->obj_).size_;
  if (uVar1 < uVar3) {
    uVar3 = uVar1;
  }
  lVar2 = uVar3 * 0x1e8;
  while( true ) {
    bVar4 = uVar3 == 0;
    uVar3 = uVar3 - 1;
    if (bVar4) break;
    dVar5 = mp::ComputeValue<mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
                      ((mp *)(this[-7].recomp_fn.super__Function_base._M_manager + lVar2 + -0x1e8),
                       (QuadraticObjective *)chk,x);
    viol.viol_ = ABS((chk->obj_).data_[uVar3] - dVar5);
    viol.valX_ = dVar5;
    ViolSummary::CheckViol
              (&chk->viol_obj_,viol,
               *(double *)((long)&this[7].recomp_fn.super__Function_base._M_functor + 8),
               (double)this[7].recomp_fn.super__Function_base._M_manager,
               *(char **)(this[-7].recomp_fn.super__Function_base._M_manager + lVar2 + -0x168));
    x = extraout_RDX;
    lVar2 = lVar2 + -0x1e8;
  }
  return;
}

Assistant:

void CheckObjs(SolCheck& chk) {
    const auto& objs = MPCD( GetModel() ).get_objectives();
    // Solvers might have dummy obj.
    // Unbounded problems might have no obj value.
    for (auto i
         =std::min(objs.size(), chk.obj_vals().size());
         i--; ) {
      auto val1 = ComputeValue(objs[i], chk.x_ext());
      chk.ObjViols().CheckViol(
            {std::fabs(chk.obj_vals()[i] - val1), val1},
            MPCD( sol_feas_tol() ), MPCD( sol_feas_tol_rel() ),
            objs[i].name());
    }
  }